

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ComputeCumulativeSumRow_SSE2(uint8_t *row,int32_t *cumsum,int32_t *previous_cumsum,int width)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [14];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [15];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 auVar31 [15];
  unkuint9 Var32;
  undefined1 auVar33 [11];
  undefined1 auVar34 [13];
  undefined1 auVar35 [14];
  undefined1 auVar36 [13];
  uint5 uVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [13];
  uint6 uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  ushort uVar60;
  uint uVar61;
  int width_local;
  int32_t *previous_cumsum_local;
  int32_t *cumsum_local;
  uint8_t *row_local;
  
  iVar47 = 0;
  iVar51 = 0;
  iVar55 = 0;
  iVar59 = 0;
  iVar42 = width + -4;
  if ((3 < width) && (iVar43 = iVar42, ((ulong)cumsum & 0xf) == 0)) {
    do {
      auVar1 = *(undefined1 (*) [16])row;
      row = (uint8_t *)((long)row + 0x10);
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar1._0_13_;
      auVar4[0xe] = auVar1[7];
      auVar6[0xc] = auVar1[6];
      auVar6._0_12_ = auVar1._0_12_;
      auVar6._13_2_ = auVar4._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar1._0_11_;
      auVar7._12_3_ = auVar6._12_3_;
      uVar2 = auVar7._11_4_;
      auVar10[10] = auVar1[5];
      auVar10._0_10_ = auVar1._0_10_;
      auVar10._11_4_ = uVar2;
      auVar12[9] = 0;
      auVar12._0_9_ = auVar1._0_9_;
      auVar12._10_5_ = auVar10._10_5_;
      auVar13[8] = auVar1[4];
      auVar13._0_8_ = auVar1._0_8_;
      auVar13._9_6_ = auVar12._9_6_;
      auVar31._7_8_ = 0;
      auVar31._0_7_ = auVar13._8_7_;
      Var32 = CONCAT81(SUB158(auVar31 << 0x40,7),auVar1[3]);
      auVar38._9_6_ = 0;
      auVar38._0_9_ = Var32;
      auVar33._1_10_ = SUB1510(auVar38 << 0x30,5);
      auVar33[0] = auVar1[2];
      auVar39._11_4_ = 0;
      auVar39._0_11_ = auVar33;
      auVar34._1_12_ = SUB1512(auVar39 << 0x20,3);
      auVar34[0] = auVar1[1];
      uVar60 = CONCAT11(0,auVar1[0]);
      auVar15._2_13_ = auVar34;
      auVar15._0_2_ = uVar60;
      auVar5._10_2_ = 0;
      auVar5._0_10_ = auVar15._0_10_;
      auVar5._12_2_ = (short)Var32;
      uVar41 = CONCAT42(auVar5._10_4_,auVar33._0_2_);
      auVar35._6_8_ = 0;
      auVar35._0_6_ = uVar41;
      uVar61 = CONCAT13(0,CONCAT12(auVar1[9],(ushort)auVar1[8]));
      auVar8[0xc] = auVar1[0xb];
      auVar8._0_12_ = ZEXT112(auVar1[0xc]) << 0x40;
      auVar9._10_3_ = auVar8._10_3_;
      auVar9._0_10_ = (unkuint10)auVar1[10] << 0x40;
      auVar36._5_8_ = 0;
      auVar36._0_5_ = auVar9._8_5_;
      auVar11[4] = auVar1[9];
      auVar11._0_4_ = uVar61;
      auVar11[5] = 0;
      auVar11._6_7_ = SUB137(auVar36 << 0x40,6);
      iVar44 = iVar47 + (uint)uVar60;
      iVar48 = iVar51 + (int)CONCAT82(SUB148(auVar35 << 0x40,6),auVar34._0_2_);
      iVar52 = iVar55 + (int)uVar41;
      iVar56 = iVar59 + (auVar5._10_4_ >> 0x10);
      iVar42 = *previous_cumsum;
      iVar16 = previous_cumsum[1];
      iVar17 = previous_cumsum[2];
      iVar18 = previous_cumsum[3];
      iVar45 = iVar44 + (uint)auVar13._8_2_;
      iVar49 = iVar48 + (uint)auVar10._10_2_;
      iVar53 = iVar52 + (uVar2 >> 8 & 0xffff);
      iVar57 = iVar56 + (uVar2 >> 0x18);
      iVar19 = previous_cumsum[4];
      iVar20 = previous_cumsum[5];
      iVar21 = previous_cumsum[6];
      iVar22 = previous_cumsum[7];
      iVar46 = iVar45 + (uVar61 & 0xffff);
      iVar50 = iVar49 + auVar11._4_4_;
      iVar54 = iVar53 + auVar9._8_4_;
      iVar58 = iVar57 + (uint)(uint3)(auVar8._10_3_ >> 0x10);
      iVar23 = previous_cumsum[8];
      iVar24 = previous_cumsum[9];
      iVar25 = previous_cumsum[10];
      iVar26 = previous_cumsum[0xb];
      iVar47 = iVar46 + (uint)auVar1[0xc];
      iVar51 = iVar50 + (uint)auVar1[0xd];
      iVar55 = iVar54 + (uint)auVar1[0xe];
      iVar59 = iVar58 + (uint)auVar1[0xf];
      iVar27 = previous_cumsum[0xc];
      iVar28 = previous_cumsum[0xd];
      iVar29 = previous_cumsum[0xe];
      iVar30 = previous_cumsum[0xf];
      previous_cumsum = previous_cumsum + 0x10;
      *cumsum = iVar42 + iVar44;
      cumsum[1] = iVar16 + iVar48;
      cumsum[2] = iVar17 + iVar52;
      cumsum[3] = iVar18 + iVar56;
      cumsum[4] = iVar19 + iVar45;
      cumsum[5] = iVar20 + iVar49;
      cumsum[6] = iVar21 + iVar53;
      cumsum[7] = iVar22 + iVar57;
      cumsum[8] = iVar23 + iVar46;
      cumsum[9] = iVar24 + iVar50;
      cumsum[10] = iVar25 + iVar54;
      cumsum[0xb] = iVar26 + iVar58;
      cumsum[0xc] = iVar27 + iVar47;
      cumsum[0xd] = iVar28 + iVar51;
      cumsum[0xe] = iVar29 + iVar55;
      cumsum[0xf] = iVar30 + iVar59;
      cumsum = cumsum + 0x10;
      iVar42 = iVar43 + -4;
      bVar3 = 3 < iVar43;
      iVar43 = iVar42;
    } while (bVar3);
  }
  iVar43 = iVar42 + 3;
  if (SCARRY4(iVar42,3) == iVar42 + 3 < 0) {
    do {
      uVar2 = *(uint *)*(undefined1 (*) [16])row;
      row = *(undefined1 (*) [16])row + 4;
      auVar14[0xc] = (char)(uVar2 >> 0x18);
      auVar14._0_12_ = ZEXT712(0);
      uVar37 = CONCAT32(auVar14._10_3_,(ushort)(byte)(uVar2 >> 0x10));
      auVar40._5_8_ = 0;
      auVar40._0_5_ = uVar37;
      iVar47 = iVar47 + (uVar2 & 0xff);
      iVar51 = iVar51 + (int)CONCAT72(SUB137(auVar40 << 0x40,6),(ushort)(byte)(uVar2 >> 8));
      iVar55 = iVar55 + (int)uVar37;
      iVar59 = iVar59 + (uint)(uint3)(auVar14._10_3_ >> 0x10);
      iVar42 = *previous_cumsum;
      iVar16 = previous_cumsum[1];
      iVar17 = previous_cumsum[2];
      iVar18 = previous_cumsum[3];
      previous_cumsum = previous_cumsum + 4;
      *cumsum = iVar42 + iVar47;
      cumsum[1] = iVar16 + iVar51;
      cumsum[2] = iVar17 + iVar55;
      cumsum[3] = iVar18 + iVar59;
      cumsum = cumsum + 4;
      bVar3 = 0 < iVar43;
      iVar43 = iVar43 + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void ComputeCumulativeSumRow_SSE2(const uint8_t* row,
                                  int32_t* cumsum,
                                  const int32_t* previous_cumsum,
                                  int width) {
  asm volatile(
      "pxor        %%xmm0,%%xmm0                 \n"
      "pxor        %%xmm1,%%xmm1                 \n"
      "sub         $0x4,%3                       \n"
      "jl          49f                           \n"
      "test        $0xf,%1                       \n"
      "jne         49f                           \n"

      // 4 pixel loop.
      LABELALIGN
      "40:                                       \n"
      "movdqu      (%0),%%xmm2                   \n"
      "lea         0x10(%0),%0                   \n"
      "movdqa      %%xmm2,%%xmm4                 \n"
      "punpcklbw   %%xmm1,%%xmm2                 \n"
      "movdqa      %%xmm2,%%xmm3                 \n"
      "punpcklwd   %%xmm1,%%xmm2                 \n"
      "punpckhwd   %%xmm1,%%xmm3                 \n"
      "punpckhbw   %%xmm1,%%xmm4                 \n"
      "movdqa      %%xmm4,%%xmm5                 \n"
      "punpcklwd   %%xmm1,%%xmm4                 \n"
      "punpckhwd   %%xmm1,%%xmm5                 \n"
      "paddd       %%xmm2,%%xmm0                 \n"
      "movdqu      (%2),%%xmm2                   \n"
      "paddd       %%xmm0,%%xmm2                 \n"
      "paddd       %%xmm3,%%xmm0                 \n"
      "movdqu      0x10(%2),%%xmm3               \n"
      "paddd       %%xmm0,%%xmm3                 \n"
      "paddd       %%xmm4,%%xmm0                 \n"
      "movdqu      0x20(%2),%%xmm4               \n"
      "paddd       %%xmm0,%%xmm4                 \n"
      "paddd       %%xmm5,%%xmm0                 \n"
      "movdqu      0x30(%2),%%xmm5               \n"
      "lea         0x40(%2),%2                   \n"
      "paddd       %%xmm0,%%xmm5                 \n"
      "movdqu      %%xmm2,(%1)                   \n"
      "movdqu      %%xmm3,0x10(%1)               \n"
      "movdqu      %%xmm4,0x20(%1)               \n"
      "movdqu      %%xmm5,0x30(%1)               \n"
      "lea         0x40(%1),%1                   \n"
      "sub         $0x4,%3                       \n"
      "jge         40b                           \n"

      "49:                                       \n"
      "add         $0x3,%3                       \n"
      "jl          19f                           \n"

      // 1 pixel loop.
      LABELALIGN
      "10:                                       \n"
      "movd        (%0),%%xmm2                   \n"
      "lea         0x4(%0),%0                    \n"
      "punpcklbw   %%xmm1,%%xmm2                 \n"
      "punpcklwd   %%xmm1,%%xmm2                 \n"
      "paddd       %%xmm2,%%xmm0                 \n"
      "movdqu      (%2),%%xmm2                   \n"
      "lea         0x10(%2),%2                   \n"
      "paddd       %%xmm0,%%xmm2                 \n"
      "movdqu      %%xmm2,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x1,%3                       \n"
      "jge         10b                           \n"

      "19:                                       \n"
      : "+r"(row),              // %0
        "+r"(cumsum),           // %1
        "+r"(previous_cumsum),  // %2
        "+r"(width)             // %3
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}